

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adhuff_common.c
# Opt level: O0

int get_node_level(adh_node_t *node)

{
  adh_node *local_20;
  adh_node_t *parent;
  int level;
  adh_node_t *node_local;
  
  parent._4_4_ = 0;
  for (local_20 = node->parent; local_20 != (adh_node *)0x0; local_20 = local_20->parent) {
    parent._4_4_ = parent._4_4_ + 1;
  }
  return parent._4_4_;
}

Assistant:

int get_node_level(const adh_node_t *node) {
#ifdef _DEBUG
    log_trace("  get_node_level", "%s \n", fmt_node(node));
#endif

    int level = 0;
    adh_node_t * parent = node->parent;
    while(parent != NULL) {
        level++;
        parent = parent->parent;
    }
    return level;
}